

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

void __thiscall
OSTEI_VRR_Algorithm_Base::Create_WithOrder
          (OSTEI_VRR_Algorithm_Base *this,QuartetSet *q,IdxOrder idx_order)

{
  int iVar1;
  _Rb_tree_const_iterator<Quartet> __last;
  bool bVar2;
  reference pvVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  const_reference pvVar6;
  int *piVar7;
  undefined8 in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<Quartet>,_bool> pVar8;
  pair<std::_Rb_tree_const_iterator<QAM>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<VRRStep>,_bool> pVar10;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar11;
  Quartet *it_5;
  iterator __end1_4;
  iterator __begin1_4;
  QuartetSet *__range1_4;
  VRRStep *its;
  iterator __end2_1;
  iterator __begin2_1;
  set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *__range2_1;
  QAM qam_1;
  pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_> *it_4;
  iterator __end1_3;
  iterator __begin1_3;
  VRR_StepMap *__range1_3;
  value_type *mit;
  iterator __end3_1;
  iterator __begin3_1;
  array<Quartet,_8UL> *__range3_1;
  int m;
  VRRStep it2_1;
  iterator __end2;
  iterator __begin2;
  VRR_StepSet *__range2;
  VRR_StepSet vs_1;
  pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_> *it_3;
  iterator __end1_2;
  iterator __begin1_2;
  VRR_StepMap *__range1_2;
  Quartet *it_2;
  iterator __end1_1;
  iterator __begin1_1;
  QuartetSet *__range1_1;
  QuartetSet not_for_me;
  value_type *it2;
  iterator __end4;
  iterator __begin4;
  array<Quartet,_8UL> *__range4;
  VRRStep vs;
  QAM qam;
  Quartet *it_1;
  iterator __end3;
  iterator __begin3;
  QuartetSet *__range3;
  QuartetSet newtargets;
  QuartetSet my_targets;
  RRStepType rrstep;
  int i;
  QuartetSet targets;
  QuartetSet solvedquartets;
  VRR_StepMap newmap;
  Quartet *it;
  iterator __end1;
  iterator __begin1;
  QuartetSet *__range1;
  QuartetSet qnew;
  QAM *in_stack_ffffffffffffe968;
  VRRStep *in_stack_ffffffffffffe970;
  int in_stack_ffffffffffffe978;
  int in_stack_ffffffffffffe97c;
  _Rb_tree_const_iterator<Quartet> in_stack_ffffffffffffe980;
  value_type *in_stack_ffffffffffffe988;
  undefined6 in_stack_ffffffffffffe990;
  undefined1 in_stack_ffffffffffffe996;
  undefined1 in_stack_ffffffffffffe997;
  undefined6 in_stack_ffffffffffffe9a8;
  undefined1 in_stack_ffffffffffffe9ae;
  undefined1 in_stack_ffffffffffffe9af;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffe9b0;
  _Rb_tree_const_iterator<int> in_stack_ffffffffffffe9c8;
  QuartetSet *in_stack_ffffffffffffe9e8;
  undefined6 in_stack_ffffffffffffe9f0;
  undefined1 in_stack_ffffffffffffe9f6;
  undefined1 in_stack_ffffffffffffe9f7;
  undefined8 in_stack_ffffffffffffea28;
  Quartet *in_stack_ffffffffffffea30;
  undefined6 in_stack_ffffffffffffea38;
  undefined1 in_stack_ffffffffffffea3e;
  undefined1 in_stack_ffffffffffffea3f;
  undefined8 in_stack_ffffffffffffea68;
  QuartetSet *in_stack_ffffffffffffea70;
  OSTEI_VRR_Algorithm_Base *in_stack_ffffffffffffea78;
  QAM *in_stack_ffffffffffffeac0;
  QAMList *in_stack_ffffffffffffeac8;
  OSTEI_VRR_Algorithm_Base *in_stack_ffffffffffffead0;
  _Self local_1408;
  _Self local_1400;
  undefined1 *local_13f8;
  _Base_ptr local_13f0;
  undefined1 local_13e8;
  _Base_ptr local_13e0;
  undefined1 local_13d8;
  _Base_ptr local_13d0;
  undefined1 local_13c8;
  _Base_ptr local_13c0;
  undefined1 local_13b8;
  _Base_ptr local_13b0;
  undefined1 local_13a8;
  _Base_ptr local_13a0;
  undefined1 local_1398;
  _Base_ptr local_1390;
  undefined1 local_1388;
  _Base_ptr local_1380;
  undefined1 local_1378;
  reference local_1370;
  _Self local_1368;
  _Self local_1360;
  set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *local_1358;
  reference local_1320;
  _Self local_1318;
  _Self local_1310;
  long local_1308;
  allocator local_12f9;
  string local_12f8 [80];
  undefined8 local_12a8;
  undefined8 uStack_12a0;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  _Base_ptr local_1278;
  undefined1 local_1270;
  iterator local_1208;
  iterator local_1200;
  iterator local_11f8;
  undefined1 *local_11f0;
  int local_1184 [35];
  int local_10f8;
  undefined1 auStack_10d0 [1368];
  _Self local_b78;
  _Self local_b70;
  undefined1 *local_b68;
  undefined1 local_b60 [48];
  reference local_b30;
  _Self local_b28;
  _Self local_b20;
  undefined1 *local_b18;
  allocator local_b09;
  string local_b08 [80];
  _Base_ptr local_ab8;
  undefined1 local_ab0;
  allocator local_aa1;
  string local_aa0 [80];
  _Base_ptr local_a50;
  undefined1 local_a48;
  reference local_a10;
  _Self local_a08;
  _Self local_a00;
  undefined1 *local_9f8;
  _Base_ptr local_9f0;
  _Base_ptr local_9e8;
  _Base_ptr local_9b0;
  undefined1 local_9a8;
  _Base_ptr local_9a0;
  undefined1 local_998;
  _Base_ptr local_990;
  undefined1 local_988;
  iterator local_980;
  iterator local_978;
  iterator local_970;
  undefined1 *local_968;
  undefined1 auStack_808 [1416];
  reference local_280;
  _Self local_278;
  _Self local_270;
  undefined1 *local_268;
  undefined1 local_200 [48];
  value_type_conflict local_1d0;
  int local_1cc;
  undefined1 local_198 [48];
  undefined1 local_168 [48];
  _Base_ptr local_138;
  undefined1 local_130;
  reference local_70;
  _Self local_68;
  _Self local_60;
  undefined8 local_58;
  undefined1 local_50 [48];
  undefined8 local_20;
  
  local_20 = in_RSI;
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x124aa4);
  local_58 = local_20;
  local_60._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  in_stack_ffffffffffffe968);
  local_68._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  in_stack_ffffffffffffe968);
  while (bVar2 = std::operator!=(&local_60,&local_68), bVar2) {
    local_70 = std::_Rb_tree_const_iterator<Quartet>::operator*
                         ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
    Quartet::notag((Quartet *)in_stack_ffffffffffffe988);
    pVar8 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                      ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                       CONCAT17(in_stack_ffffffffffffe997,
                                CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                       (value_type *)in_stack_ffffffffffffe988);
    local_138 = (_Base_ptr)pVar8.first._M_node;
    local_130 = pVar8.second;
    Quartet::~Quartet((Quartet *)in_stack_ffffffffffffe970);
    std::_Rb_tree_const_iterator<Quartet>::operator++
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
  }
  std::
  map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
  ::map((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
         *)0x124bd7);
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x124be4);
  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)in_stack_ffffffffffffe970
             ,(set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
              in_stack_ffffffffffffe968);
  PruneQuartets_((OSTEI_VRR_Algorithm_Base *)
                 CONCAT17(in_stack_ffffffffffffe9f7,
                          CONCAT16(in_stack_ffffffffffffe9f6,in_stack_ffffffffffffe9f0)),
                 in_stack_ffffffffffffe9e8);
  local_1cc = 0;
  while ((local_1cc < 4 &&
         (pvVar3 = std::array<int,_4UL>::operator[]
                             ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                              (size_type)in_stack_ffffffffffffe968), -1 < *pvVar3))) {
    pvVar3 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                        (size_type)in_stack_ffffffffffffe968);
    local_1d0 = *pvVar3;
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               in_stack_ffffffffffffe970,
               (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               in_stack_ffffffffffffe968);
    PruneQuartets_(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
                   (RRStepType)((ulong)in_stack_ffffffffffffea68 >> 0x20));
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::operator=
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               in_stack_ffffffffffffe970,
               (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
               in_stack_ffffffffffffe968);
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x124cf9);
    while (sVar4 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::size
                             ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x124d06
                             ), sVar4 != 0) {
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::set
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x124d1d);
      local_268 = local_200;
      local_270._M_node =
           (_Base_ptr)
           std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                     ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                      in_stack_ffffffffffffe968);
      local_278._M_node =
           (_Base_ptr)
           std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                     ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                      in_stack_ffffffffffffe968);
      while (bVar2 = std::operator!=(&local_270,&local_278), bVar2) {
        local_280 = std::_Rb_tree_const_iterator<Quartet>::operator*
                              ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
        Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
        Quartet::Quartet((Quartet *)
                         CONCAT17(in_stack_ffffffffffffe997,
                                  CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                         (Quartet *)in_stack_ffffffffffffe988);
        Create_Single_((OSTEI_VRR_Algorithm_Base *)
                       CONCAT17(in_stack_ffffffffffffea3f,
                                CONCAT16(in_stack_ffffffffffffea3e,in_stack_ffffffffffffea38)),
                       in_stack_ffffffffffffea30,
                       (RRStepType)((ulong)in_stack_ffffffffffffea28 >> 0x20));
        Quartet::~Quartet((Quartet *)in_stack_ffffffffffffe970);
        local_968 = auStack_808;
        local_970 = std::array<Quartet,_8UL>::begin((array<Quartet,_8UL> *)0x124e0e);
        local_978 = std::array<Quartet,_8UL>::end((array<Quartet,_8UL> *)0x124e23);
        for (; local_970 != local_978; local_970 = local_970 + 1) {
          local_980 = local_970;
          bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
          if ((bVar2) &&
             (sVar4 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::count
                                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                                 in_stack_ffffffffffffe980._M_node,
                                 (key_type *)
                                 CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978)),
             sVar4 == 0)) {
            pVar8 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                               CONCAT17(in_stack_ffffffffffffe997,
                                        CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990
                                                )),(value_type *)in_stack_ffffffffffffe988);
            local_990 = (_Base_ptr)pVar8.first._M_node;
            local_988 = pVar8.second;
          }
        }
        std::
        map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
        ::operator[]((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                      *)in_stack_ffffffffffffe9b0._M_node,
                     (key_type *)
                     CONCAT17(in_stack_ffffffffffffe9af,
                              CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
        pVar10 = std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::insert
                           ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                            CONCAT17(in_stack_ffffffffffffe997,
                                     CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                            in_stack_ffffffffffffe988);
        local_9a0 = (_Base_ptr)pVar10.first._M_node;
        local_998 = pVar10.second;
        pVar8 = std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::insert
                          ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                           CONCAT17(in_stack_ffffffffffffe997,
                                    CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                           (value_type *)in_stack_ffffffffffffe988);
        local_9b0 = (_Base_ptr)pVar8.first._M_node;
        local_9a8 = pVar8.second;
        VRRStep::~VRRStep(in_stack_ffffffffffffe970);
        QAM::~QAM((QAM *)0x125068);
        std::_Rb_tree_const_iterator<Quartet>::operator++
                  ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
      }
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::operator=
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                 in_stack_ffffffffffffe970,
                 (set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                 in_stack_ffffffffffffe968);
      PruneQuartets_(in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
                     (RRStepType)((ulong)in_stack_ffffffffffffea68 >> 0x20));
      local_9e8 = (_Base_ptr)
                  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                             in_stack_ffffffffffffe968);
      local_9f0 = (_Base_ptr)
                  std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                            ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                             in_stack_ffffffffffffe968);
      __last._M_node._4_4_ = in_stack_ffffffffffffe97c;
      __last._M_node._0_4_ = in_stack_ffffffffffffe978;
      std::set<Quartet,std::less<Quartet>,std::allocator<Quartet>>::
      insert<std::_Rb_tree_const_iterator<Quartet>>
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                 in_stack_ffffffffffffe970,in_stack_ffffffffffffe980,__last);
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x125127);
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x125134);
    }
    std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
              ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x125176);
    local_1cc = local_1cc + 1;
  }
  local_9f8 = local_198;
  local_a00._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  in_stack_ffffffffffffe968);
  local_a08._M_node =
       (_Base_ptr)
       std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                 ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                  in_stack_ffffffffffffe968);
  while (bVar2 = std::operator!=(&local_a00,&local_a08), bVar2) {
    local_a10 = std::_Rb_tree_const_iterator<Quartet>::operator*
                          ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
    Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
    pVar9 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::insert
                      ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                       CONCAT17(in_stack_ffffffffffffe997,
                                CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                       (value_type *)in_stack_ffffffffffffe988);
    local_a50 = (_Base_ptr)pVar9.first._M_node;
    local_a48 = pVar9.second;
    QAM::~QAM((QAM *)0x12528c);
    std::_Rb_tree_const_iterator<Quartet>::operator++
              ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_aa0,"",&local_aa1);
  QAM::QAM((QAM *)in_stack_ffffffffffffe980._M_node,in_stack_ffffffffffffe97c,
           in_stack_ffffffffffffe978,(int)((ulong)in_stack_ffffffffffffe970 >> 0x20),
           (int)in_stack_ffffffffffffe970,(string *)in_stack_ffffffffffffe968);
  pVar9 = std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::insert
                    ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                     CONCAT17(in_stack_ffffffffffffe997,
                              CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                     (value_type *)in_stack_ffffffffffffe988);
  local_ab8 = (_Base_ptr)pVar9.first._M_node;
  local_ab0 = pVar9.second;
  QAM::~QAM((QAM *)0x125381);
  std::__cxx11::string::~string(local_aa0);
  std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b08,"",&local_b09);
  QAM::QAM((QAM *)in_stack_ffffffffffffe980._M_node,in_stack_ffffffffffffe97c,
           in_stack_ffffffffffffe978,(int)((ulong)in_stack_ffffffffffffe970 >> 0x20),
           (int)in_stack_ffffffffffffe970,(string *)in_stack_ffffffffffffe968);
  pmVar5 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
           operator[]((map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_> *)
                      in_stack_ffffffffffffe9b0._M_node,
                      (key_type *)
                      CONCAT17(in_stack_ffffffffffffe9af,
                               CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
  *pmVar5 = 0;
  QAM::~QAM((QAM *)0x125441);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator((allocator<char> *)&local_b09);
  local_b18 = local_168;
  local_b20._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
       ::begin((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                *)in_stack_ffffffffffffe968);
  local_b28._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
       ::end((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
              *)in_stack_ffffffffffffe968);
  while (bVar2 = std::operator!=(&local_b20,&local_b28), bVar2) {
    local_b30 = std::
                _Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                             *)0x1254c0);
    std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::set
              ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
               in_stack_ffffffffffffe970,
               (set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
               in_stack_ffffffffffffe968);
    local_b68 = local_b60;
    local_b70._M_node =
         (_Base_ptr)
         std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::begin
                   ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                    in_stack_ffffffffffffe968);
    local_b78._M_node =
         (_Base_ptr)
         std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::end
                   ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                    in_stack_ffffffffffffe968);
    while (bVar2 = std::operator!=(&local_b70,&local_b78), bVar2) {
      std::_Rb_tree_const_iterator<VRRStep>::operator*((_Rb_tree_const_iterator<VRRStep> *)0x125548)
      ;
      VRRStep::VRRStep((VRRStep *)
                       CONCAT17(in_stack_ffffffffffffe997,
                                CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                       in_stack_ffffffffffffe988);
      local_1184[0] = local_10f8;
      Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
      pmVar5 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
               operator[]((map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>
                           *)in_stack_ffffffffffffe9b0._M_node,
                          (key_type *)
                          CONCAT17(in_stack_ffffffffffffe9af,
                                   CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
      piVar7 = std::max<int>(local_1184,pmVar5);
      iVar1 = *piVar7;
      Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
      pmVar5 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
               operator[]((map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>
                           *)in_stack_ffffffffffffe9b0._M_node,
                          (key_type *)
                          CONCAT17(in_stack_ffffffffffffe9af,
                                   CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
      *pmVar5 = iVar1;
      QAM::~QAM((QAM *)0x12564e);
      QAM::~QAM((QAM *)0x12565b);
      local_10f8 = 0;
      local_11f0 = auStack_10d0;
      local_11f8 = std::array<Quartet,_8UL>::begin((array<Quartet,_8UL> *)0x125689);
      local_1200 = std::array<Quartet,_8UL>::end((array<Quartet,_8UL> *)0x12569e);
      for (; local_11f8 != local_1200; local_11f8 = local_11f8 + 1) {
        local_1208 = local_11f8;
        in_stack_ffffffffffffead0 = (OSTEI_VRR_Algorithm_Base *)&local_11f8->m;
        Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
        in_stack_ffffffffffffeac8 =
             (QAMList *)
             std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
             operator[]((map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>
                         *)in_stack_ffffffffffffe9b0._M_node,
                        (key_type *)
                        CONCAT17(in_stack_ffffffffffffe9af,
                                 CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
        in_stack_ffffffffffffeac0 =
             (QAM *)std::max<int>((int *)in_stack_ffffffffffffead0,(int *)in_stack_ffffffffffffeac8)
        ;
        iVar1 = (in_stack_ffffffffffffeac0->qam)._M_elems[0];
        Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
        pmVar5 = std::map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>::
                 operator[]((map<QAM,_int,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_int>_>_>
                             *)in_stack_ffffffffffffe9b0._M_node,
                            (key_type *)
                            CONCAT17(in_stack_ffffffffffffe9af,
                                     CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)))
        ;
        *pmVar5 = iVar1;
        QAM::~QAM((QAM *)0x1257c1);
        QAM::~QAM((QAM *)0x1257ce);
        local_1208->m = local_1208->m - local_1184[0];
      }
      std::
      map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
      ::operator[]((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                    *)in_stack_ffffffffffffe9b0._M_node,
                   (key_type *)
                   CONCAT17(in_stack_ffffffffffffe9af,
                            CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
      pVar10 = std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::insert
                         ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                          CONCAT17(in_stack_ffffffffffffe997,
                                   CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)),
                          in_stack_ffffffffffffe988);
      local_1278 = (_Base_ptr)pVar10.first._M_node;
      local_1270 = pVar10.second;
      VRRStep::~VRRStep(in_stack_ffffffffffffe970);
      std::_Rb_tree_const_iterator<VRRStep>::operator++
                ((_Rb_tree_const_iterator<VRRStep> *)in_stack_ffffffffffffe970);
    }
    std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::~set
              ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)0x125a47);
    std::
    _Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                  *)in_stack_ffffffffffffe970);
  }
  local_1288 = 0;
  uStack_1280 = 0;
  local_1298 = 0;
  uStack_1290 = 0;
  local_12a8 = 0;
  uStack_12a0 = 0;
  std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::set
            ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)0x125a93);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12f8,"",&local_12f9);
  QAM::QAM((QAM *)in_stack_ffffffffffffe980._M_node,in_stack_ffffffffffffe97c,
           in_stack_ffffffffffffe978,(int)((ulong)in_stack_ffffffffffffe970 >> 0x20),
           (int)in_stack_ffffffffffffe970,(string *)in_stack_ffffffffffffe968);
  std::
  map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
  ::operator[]((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                *)in_stack_ffffffffffffe9b0._M_node,
               (key_type *)
               CONCAT17(in_stack_ffffffffffffe9af,
                        CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
  std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::operator=
            ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)in_stack_ffffffffffffe970
             ,(set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
              in_stack_ffffffffffffe968);
  QAM::~QAM((QAM *)0x125b40);
  std::__cxx11::string::~string(local_12f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12f9);
  std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::~set
            ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)0x125b67);
  *(undefined4 *)(in_RDI + 0x268) = 0;
  local_1308 = in_RDI + 0x160;
  local_1310._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
       ::begin((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
                *)in_stack_ffffffffffffe968);
  local_1318._M_node =
       (_Base_ptr)
       std::
       map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
       ::end((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
              *)in_stack_ffffffffffffe968);
  do {
    bVar2 = std::operator!=(&local_1310,&local_1318);
    if (!bVar2) {
      local_13f8 = local_50;
      local_1400._M_node =
           (_Base_ptr)
           std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::begin
                     ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                      in_stack_ffffffffffffe968);
      local_1408._M_node =
           (_Base_ptr)
           std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::end
                     ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)
                      in_stack_ffffffffffffe968);
      while (bVar2 = std::operator!=(&local_1400,&local_1408), bVar2) {
        std::_Rb_tree_const_iterator<Quartet>::operator*
                  ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
        in_stack_ffffffffffffe970 = (VRRStep *)(in_RDI + 0x1c0);
        Quartet::amlist((Quartet *)in_stack_ffffffffffffe9c8._M_node);
        AMOrder_AddWithDependencies_
                  (in_stack_ffffffffffffead0,in_stack_ffffffffffffeac8,in_stack_ffffffffffffeac0);
        QAM::~QAM((QAM *)0x1265a0);
        std::_Rb_tree_const_iterator<Quartet>::operator++
                  ((_Rb_tree_const_iterator<Quartet> *)in_stack_ffffffffffffe970);
      }
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x1265e2);
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x1265ef);
      std::
      map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
      ::~map((map<QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>_>
              *)0x1265fc);
      std::set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_>::~set
                ((set<Quartet,_std::less<Quartet>,_std::allocator<Quartet>_> *)0x126609);
      return;
    }
    local_1320 = std::
                 _Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                              *)0x125bdc);
    QAM::QAM((QAM *)in_stack_ffffffffffffe970,in_stack_ffffffffffffe968);
    local_1358 = &local_1320->second;
    local_1360._M_node =
         (_Base_ptr)
         std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::begin
                   ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                    in_stack_ffffffffffffe968);
    local_1368._M_node =
         (_Base_ptr)
         std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>::end
                   ((set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_> *)
                    in_stack_ffffffffffffe968);
    while (bVar2 = std::operator!=(&local_1360,&local_1368), bVar2) {
      local_1370 = std::_Rb_tree_const_iterator<VRRStep>::operator*
                             ((_Rb_tree_const_iterator<VRRStep> *)0x125c64);
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                          (size_type)in_stack_ffffffffffffe968);
      piVar7 = std::max<int>(pvVar6,(int *)(in_RDI + 0x268));
      *(int *)(in_RDI + 0x268) = *piVar7;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                          (size_type)in_stack_ffffffffffffe968);
      piVar7 = std::max<int>(pvVar6,(int *)(in_RDI + 0x268));
      *(int *)(in_RDI + 0x268) = *piVar7;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                          (size_type)in_stack_ffffffffffffe968);
      piVar7 = std::max<int>(pvVar6,(int *)(in_RDI + 0x268));
      *(int *)(in_RDI + 0x268) = *piVar7;
      pvVar6 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                          (size_type)in_stack_ffffffffffffe968);
      piVar7 = std::max<int>(pvVar6,(int *)(in_RDI + 0x268));
      *(int *)(in_RDI + 0x268) = *piVar7;
      if ((local_1370->type == I) || (local_1370->type == J)) {
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if (bVar2) {
LAB_00125e63:
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          local_1380 = (_Base_ptr)pVar11.first._M_node;
          local_1378 = pVar11.second;
        }
        else {
          std::array<Quartet,_8UL>::operator[]
                    ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
          if (bVar2) goto LAB_00125e63;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if (bVar2) {
LAB_00125ff2:
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          local_1390 = (_Base_ptr)pVar11.first._M_node;
          local_1388 = pVar11.second;
        }
        else {
          std::array<Quartet,_8UL>::operator[]
                    ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
          if (bVar2) goto LAB_00125ff2;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if (bVar2) {
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          local_13a0 = (_Base_ptr)pVar11.first._M_node;
          local_1398 = pVar11.second;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if (bVar2) {
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          local_13b0 = (_Base_ptr)pVar11.first._M_node;
          local_13a8 = pVar11.second;
        }
      }
      else {
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if (bVar2) {
LAB_00126235:
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          in_stack_ffffffffffffe9c8 = pVar11.first._M_node;
          local_13b8 = pVar11.second;
          local_13c0 = in_stack_ffffffffffffe9c8._M_node;
        }
        else {
          std::array<Quartet,_8UL>::operator[]
                    ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
          if (bVar2) goto LAB_00126235;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if (bVar2) {
LAB_00126303:
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          in_stack_ffffffffffffe9b0 = pVar11.first._M_node;
          in_stack_ffffffffffffe9af = pVar11.second;
          local_13d0 = in_stack_ffffffffffffe9b0._M_node;
          local_13c8 = in_stack_ffffffffffffe9af;
        }
        else {
          std::array<Quartet,_8UL>::operator[]
                    ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          bVar2 = Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
          if (bVar2) goto LAB_00126303;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        in_stack_ffffffffffffe9ae =
             Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if ((bool)in_stack_ffffffffffffe9ae) {
          std::
          map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        *)in_stack_ffffffffffffe9b0._M_node,
                       (key_type *)
                       CONCAT17(in_stack_ffffffffffffe9af,
                                CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)));
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          local_13e0 = (_Base_ptr)pVar11.first._M_node;
          in_stack_ffffffffffffe997 = pVar11.second;
          local_13d8 = in_stack_ffffffffffffe997;
        }
        std::array<Quartet,_8UL>::operator[]
                  ((array<Quartet,_8UL> *)in_stack_ffffffffffffe970,
                   (size_type)in_stack_ffffffffffffe968);
        in_stack_ffffffffffffe996 =
             Quartet::operator_cast_to_bool((Quartet *)in_stack_ffffffffffffe970);
        if ((bool)in_stack_ffffffffffffe996) {
          in_stack_ffffffffffffe988 =
               (value_type *)
               std::
               map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[]((map<QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<QAM>,_std::allocator<std::pair<const_QAM,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                             *)in_stack_ffffffffffffe9b0._M_node,
                            (key_type *)
                            CONCAT17(in_stack_ffffffffffffe9af,
                                     CONCAT16(in_stack_ffffffffffffe9ae,in_stack_ffffffffffffe9a8)))
          ;
          std::array<int,_4UL>::operator[]
                    ((array<int,_4UL> *)in_stack_ffffffffffffe970,
                     (size_type)in_stack_ffffffffffffe968);
          pVar11 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)
                              CONCAT17(in_stack_ffffffffffffe997,
                                       CONCAT16(in_stack_ffffffffffffe996,in_stack_ffffffffffffe990)
                                      ),(value_type_conflict *)in_stack_ffffffffffffe988);
          local_13f0 = (_Base_ptr)pVar11.first._M_node;
          local_13e8 = pVar11.second;
        }
      }
      std::_Rb_tree_const_iterator<VRRStep>::operator++
                ((_Rb_tree_const_iterator<VRRStep> *)in_stack_ffffffffffffe970);
    }
    QAM::~QAM((QAM *)0x1264cb);
    std::
    _Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_QAM,_std::set<VRRStep,_std::less<VRRStep>,_std::allocator<VRRStep>_>_>_>
                  *)in_stack_ffffffffffffe970);
  } while( true );
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create_WithOrder(const QuartetSet & q, IdxOrder idx_order)
{
    // holds the requirements for each am
    // so store what we initially want
    //PrintQuartetSet(q, "Initial VRR");

    // strip off the tags. They don't mean anything in VRR
    QuartetSet qnew;
    for(auto & it : q)
        qnew.insert(it.notag());


    VRR_StepMap newmap;

    // solved quartets
    QuartetSet solvedquartets;

    // unsolved quartets
    QuartetSet targets = qnew;
    PruneQuartets_(targets);

    for(int i = 0; i < 4; i++)
    {
        // check if we should stop
        if(idx_order[i] < 0)
            break;

        RRStepType rrstep = static_cast<RRStepType>(idx_order[i]);

        QuartetSet my_targets = targets;

        // set targets to be everything we aren't doing 
        targets = PruneQuartets_(my_targets, rrstep);

        while(my_targets.size())
        {
            QuartetSet newtargets;

            for(const auto & it : my_targets)
            {
                QAM qam = it.amlist();

                VRRStep vs = Create_Single_(it, rrstep);

                // add new targets
                for(const auto & it2 : vs.src)
                {
                    if(it2)
                    {
                        if(solvedquartets.count(it2) == 0)
                            newtargets.insert(it2);
                    }
                }

                newmap[qam].insert(vs);
                solvedquartets.insert(it);
            }

            // now get what I need to do
            my_targets = newtargets;
            QuartetSet not_for_me = PruneQuartets_(my_targets, rrstep);

            // add anything that is not my responsibility to the
            // main targets list. These might not be a part of
            // that list right now. 
            targets.insert(not_for_me.begin(),
                           not_for_me.end());
        }
    } 

    // save the solved quartets
    for(const auto & it : solvedquartets)
        allam_.insert(it.amlist());
    allam_.insert({0,0,0,0});

    // and we must do at least (s s | s s)^0
    vrrmreq_max_[{0,0,0,0}] = 0;

    // Handle the needed m values
    // For now, add all to the zero m value
    // but store the max m values needed
    for(auto & it : newmap)
    {
        VRR_StepSet vs = it.second;

        // notice it2 is a copy
        for(auto it2 : vs)
        {
            int m = it2.target.m;

            vrrmreq_max_[it2.target.amlist()] = std::max(m, vrrmreq_max_[it2.target.amlist()]);

            it2.target.m = 0;
            for(auto & mit : it2.src)
            {
                vrrmreq_max_[mit.amlist()] = std::max(mit.m, vrrmreq_max_[mit.amlist()]);
                mit.m -= m;
            }
   
            vrrmap_[it.first].insert(it2);
        } 
    }


    // and empty step list for s s s s
    vrrmap_[{0,0,0,0}] = VRR_StepSet();

    // determine requirements for all QAM
    // and the maximum integer constant
    maxint_ = 0;
    for(const auto & it : vrrmap_) // for all QAM
    {
        QAM qam = it.first;

        for(const auto & its : it.second)  // for all steps for this QAM
        {
            maxint_ = std::max(its.ijkl[0], maxint_);
            maxint_ = std::max(its.ijkl[1], maxint_);
            maxint_ = std::max(its.ijkl[2], maxint_);
            maxint_ = std::max(its.ijkl[3], maxint_);

            if(its.type == RRStepType::I || its.type == RRStepType::J)
            {
                if(its.src[2] || its.src[3])
                    qamint_2p_[qam].insert(its.ijkl[0]);

                if(its.src[4] || its.src[5])
                    qamint_2p_[qam].insert(its.ijkl[1]);

                if(its.src[6])
                    qamint_2pq_[qam].insert(its.ijkl[2]);

                if(its.src[7])
                    qamint_2pq_[qam].insert(its.ijkl[3]);
            }
            else
            {
                if(its.src[2] || its.src[3])
                    qamint_2q_[qam].insert(its.ijkl[2]);

                if(its.src[4] || its.src[5])
                    qamint_2q_[qam].insert(its.ijkl[3]);

                if(its.src[6])
                    qamint_2pq_[qam].insert(its.ijkl[0]);

                if(its.src[7])
                    qamint_2pq_[qam].insert(its.ijkl[1]);
            }
        }
    }


    // order the AM
    for(const auto & it : qnew) 
        AMOrder_AddWithDependencies_(amorder_, it.amlist());

}